

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_get_buffer_internal(qpdf_data qpdf)

{
  bool bVar1;
  QPDFWriter local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  if (((qpdf->write_memory & 1U) != 0) &&
     (local_10 = qpdf, bVar1 = std::operator==(&qpdf->output_buffer,(nullptr_t)0x0), bVar1)) {
    std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_10->qpdf_writer);
    QPDFWriter::getBufferSharedPointer(&local_20);
    std::shared_ptr<Buffer>::operator=(&local_10->output_buffer,(shared_ptr<Buffer> *)&local_20);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&local_20);
  }
  return;
}

Assistant:

static void
qpdf_get_buffer_internal(qpdf_data qpdf)
{
    if (qpdf->write_memory && (qpdf->output_buffer == nullptr)) {
        qpdf->output_buffer = qpdf->qpdf_writer->getBufferSharedPointer();
    }
}